

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  ArrayPtr<const_char> AVar4;
  Reader local_88;
  Reader local_58;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  Declaration::Param::Reader::getName(&local_88,decl);
  AVar4 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_88);
  (this->name).content = AVar4;
  (this->declId)._reader.data = (void *)0x0;
  (this->declId)._reader.pointers = (WirePointer *)0x0;
  (this->declId)._reader.segment = (SegmentReader *)0x0;
  (this->declId)._reader.capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&(this->declId)._reader.pointers + 6) = 0;
  (this->declId)._reader.nestingLimit = 0x7fffffff;
  this->declKind = FIELD;
  this->isParam = true;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  Declaration::Param::Reader::getAnnotations(&this->declAnnotations,decl);
  uVar1 = (decl->_reader).dataSize;
  if (uVar1 < 0x40) {
    this->startByte = 0;
    uVar3 = 0;
  }
  else {
    pvVar2 = (decl->_reader).data;
    this->startByte = *(uint *)((long)pvVar2 + 4);
    uVar3 = 0;
    if (0x5f < uVar1) {
      uVar3 = *(uint *)((long)pvVar2 + 8);
    }
  }
  this->endByte = uVar3;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  Declaration::Param::Reader::getType((Reader *)&local_88,decl);
  (this->fieldType)._reader.dataSize = local_88._reader.dataSize;
  (this->fieldType)._reader.pointerCount = local_88._reader.pointerCount;
  *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_88._reader._38_2_;
  (this->fieldType)._reader.nestingLimit = local_88._reader.nestingLimit;
  *(undefined4 *)&(this->fieldType)._reader.field_0x2c = local_88._reader._44_4_;
  (this->fieldType)._reader.data = local_88._reader.data;
  (this->fieldType)._reader.pointers = local_88._reader.pointers;
  (this->fieldType)._reader.segment = local_88._reader.segment;
  (this->fieldType)._reader.capTable = local_88._reader.capTable;
  if ((0xf < (decl->_reader).dataSize) && (*(decl->_reader).data == 1)) {
    this->hasDefaultValue = true;
    local_58._reader.segment = (decl->_reader).segment;
    local_58._reader.capTable = (decl->_reader).capTable;
    local_58._reader.data = (decl->_reader).data;
    local_58._reader.pointers = (decl->_reader).pointers;
    local_58._reader.dataSize = (decl->_reader).dataSize;
    local_58._reader.pointerCount = (decl->_reader).pointerCount;
    local_58._reader._38_2_ = *(undefined2 *)&(decl->_reader).field_0x26;
    local_58._reader.nestingLimit = (decl->_reader).nestingLimit;
    local_58._reader._44_4_ = *(undefined4 *)&(decl->_reader).field_0x2c;
    Declaration::Param::DefaultValue::Reader::getValue((Reader *)&local_88,&local_58);
    (this->fieldDefaultValue)._reader.dataSize = local_88._reader.dataSize;
    (this->fieldDefaultValue)._reader.pointerCount = local_88._reader.pointerCount;
    *(undefined2 *)&(this->fieldDefaultValue)._reader.field_0x26 = local_88._reader._38_2_;
    (this->fieldDefaultValue)._reader.nestingLimit = local_88._reader.nestingLimit;
    *(undefined4 *)&(this->fieldDefaultValue)._reader.field_0x2c = local_88._reader._44_4_;
    (this->fieldDefaultValue)._reader.data = local_88._reader.data;
    (this->fieldDefaultValue)._reader.pointers = local_88._reader.pointers;
    (this->fieldDefaultValue)._reader.segment = local_88._reader.segment;
    (this->fieldDefaultValue)._reader.capTable = local_88._reader.capTable;
  }
  return;
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Param::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declKind(Declaration::FIELD), isParam(true),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      fieldType = decl.getType();
      if (decl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = decl.getDefaultValue().getValue();
      }
    }